

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O3

bool __thiscall
Rml::Element::AddAnimationKeyTime
          (Element *this,PropertyId property_id,Property *target_value,float time,Tween tween)

{
  bool bVar1;
  pointer this_00;
  
  if ((target_value == (Property *)0x0) &&
     (target_value = ElementStyle::GetProperty(&this->meta->style,property_id),
     target_value == (Property *)0x0)) {
    return false;
  }
  this_00 = (this->animations).
            super__Vector_base<Rml::ElementAnimation,_std::allocator<Rml::ElementAnimation>_>.
            _M_impl.super__Vector_impl_data._M_start;
  while( true ) {
    if (this_00 ==
        (this->animations).
        super__Vector_base<Rml::ElementAnimation,_std::allocator<Rml::ElementAnimation>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      return false;
    }
    if (this_00->property_id == property_id) break;
    this_00 = this_00 + 1;
  }
  bVar1 = ElementAnimation::AddKey(this_00,time,target_value,this,tween,true);
  return bVar1;
}

Assistant:

bool Element::AddAnimationKeyTime(PropertyId property_id, const Property* target_value, float time, Tween tween)
{
	if (!target_value)
		target_value = meta->style.GetProperty(property_id);
	if (!target_value)
		return false;

	ElementAnimation* animation = nullptr;

	for (auto& existing_animation : animations)
	{
		if (existing_animation.GetPropertyId() == property_id)
		{
			animation = &existing_animation;
			break;
		}
	}
	if (!animation)
		return false;

	bool result = animation->AddKey(time, *target_value, *this, tween, true);

	return result;
}